

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream.h
# Opt level: O0

void fmt::v5::internal::format_value<char,BasicTestString<char>>
               (basic_buffer<char> *buffer,BasicTestString<char> *value)

{
  undefined8 uVar1;
  basic_buffer<char> *in_RDI;
  basic_ostream<char,_std::char_traits<char>_> output;
  formatbuf<char> format_buf;
  basic_buffer<char> *in_stack_fffffffffffffe68;
  formatbuf<char> *in_stack_fffffffffffffe70;
  long local_168 [34];
  streambuf local_58 [80];
  basic_buffer<char> *local_8;
  
  local_8 = in_RDI;
  formatbuf<char>::formatbuf(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  std::ostream::ostream(local_168,local_58);
  uVar1 = *(undefined8 *)(local_168[0] + -0x18);
  std::operator|(_S_failbit,_S_badbit);
  std::ios::exceptions((int)local_168 + (int)uVar1);
  ::operator<<((basic_ostream<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe70,
               (BasicTestString<char> *)in_stack_fffffffffffffe68);
  basic_buffer<char>::size(local_8);
  basic_buffer<char>::resize(local_8,(size_t)in_stack_fffffffffffffe68);
  std::ostream::~ostream(local_168);
  formatbuf<char>::~formatbuf((formatbuf<char> *)0x16f2be);
  return;
}

Assistant:

void format_value(basic_buffer<Char> &buffer, const T &value) {
  internal::formatbuf<Char> format_buf(buffer);
  std::basic_ostream<Char> output(&format_buf);
  output.exceptions(std::ios_base::failbit | std::ios_base::badbit);
  output << value;
  buffer.resize(buffer.size());
}